

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O2

size_t str_format(char *dst,size_t size,char *format,char **params,size_t nparams)

{
  char *__s2;
  char *__s1;
  int iVar1;
  char *pcVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  size_t sVar6;
  long lVar7;
  char cVar8;
  size_t __n;
  size_t sVar9;
  ulong uVar10;
  bool bVar11;
  bool bVar12;
  char *local_60;
  
  sVar6 = 0;
  local_60 = dst;
  do {
    pcVar2 = format;
    if (*format == '\0') {
LAB_00106949:
      if (format < pcVar2) {
        lVar7 = strlcpy(local_60,format,size);
        sVar6 = sVar6 + lVar7;
      }
      return sVar6;
    }
    pcVar2 = strpbrk(format,"{\\");
    if (pcVar2 == (char *)0x0) {
      lVar7 = strlcpy(local_60,format,size);
      sVar6 = sVar6 + lVar7;
      pcVar2 = (char *)0x0;
      goto LAB_00106949;
    }
    uVar3 = (long)pcVar2 - (long)format;
    if (size == 0) {
      size = 0;
    }
    else {
      uVar5 = size - 1;
      if (uVar3 < size) {
        uVar5 = uVar3;
      }
      strlcpy(local_60,format,uVar5 + 1);
      local_60 = local_60 + uVar5;
      size = size - uVar5;
    }
    __s2 = pcVar2 + 1;
    if (*pcVar2 == '{') {
      pcVar4 = strchr(pcVar2,0x7d);
      if (pcVar4 == (char *)0x0) {
        return 0;
      }
      __n = (long)pcVar4 - (long)__s2;
      for (sVar9 = 0; nparams != sVar9; sVar9 = sVar9 + 1) {
        __s1 = params[sVar9];
        iVar1 = strncmp(__s1,__s2,__n);
        if ((iVar1 == 0) && (__s1[__n] == '\0')) {
          uVar5 = strlcpy(local_60,__s1 + __n + 1,size);
          uVar10 = size - 1;
          bVar11 = size < uVar5;
          size = size - uVar5;
          bVar12 = size != 0;
          if (bVar11) {
            size = 0;
          }
          if (!bVar11 && bVar12) {
            uVar10 = uVar5;
          }
          goto LAB_00106904;
        }
      }
      uVar5 = __n + 2;
      uVar10 = size - 1;
      if (uVar5 < size) {
        uVar10 = uVar5;
      }
      strlcpy(local_60,pcVar2,uVar10 + 1);
      size = size - uVar10;
LAB_00106904:
      local_60 = local_60 + uVar10;
    }
    else {
      cVar8 = pcVar2[1];
      pcVar4 = __s2;
      if (cVar8 == '\0') {
        pcVar4 = pcVar2;
      }
      if (1 < size) {
        if (cVar8 == '\0') {
          cVar8 = *pcVar2;
        }
        *local_60 = cVar8;
        local_60 = local_60 + 1;
        size = size - 1;
      }
      uVar5 = 1;
    }
    sVar6 = uVar3 + sVar6 + uVar5;
    format = pcVar4 + 1;
  } while( true );
}

Assistant:

size_t str_format(char *dst, size_t size, const char *format, const char *params[], size_t nparams)
{
    const char *pos, *copy = format;
    char *write = dst;

    size_t space = size;
    size_t space_needed = 0;

    for (pos = format; *pos; ++pos) {
        pos = strpbrk(pos, "{\\");
        if (!pos) {
            /* no more tokens, copy remainder of format string to output */
            space_needed += str_strlcpy(write, copy, space);
            break;
        }
        else {
            size_t bytes = pos - copy;
            /* found the start of a new token, copy `bytes` of lead text from [copy, pos) */
            space_needed += bytes;
            if (space > 0) {
                if (bytes >= space) {
                    bytes = space - 1;
                }
                str_strlcpy(write, copy, bytes + 1);
                write += bytes;
                space -= bytes;
            }
        }
        if (*pos == '{') {
            const char *token = pos + 1;

            copy = strchr(pos, '}');
            if (!copy) {
                /* syntax error: unterminated token */
                return 0;
            }
            else {
                /* found a token in the [token, copy) interval */
                size_t keylen = copy - token;
                size_t n;
                const char *val = NULL;
                for (n = 0; n != nparams; ++n) {
                    const char *key = params[n];
                    if (0 == strncmp(key, token, keylen)) {
                        /* param matches token? */
                        if (key[keylen] == '\0') {
                            val = key + keylen + 1;
                            break;
                        }
                    }
                }
                if (val) {
                    size_t slen = str_strlcpy(write, val, space);
                    space_needed += slen;
                    if (slen < space) {
                        space -= slen;
                        write += slen;
                    }
                    else {
                        /* buffer is full */
                        write += space - 1;
                        space = 0;
                    }
                }
                else {
                    /* token not found, copy [pos, copy] to output instead */
                    size_t bytes = keylen + 2;
                    space_needed += bytes;
                    if (bytes >= space) {
                        bytes = space - 1;
                    }
                    str_strlcpy(write, pos, bytes + 1);
                    write += bytes;
                    space -= bytes;
                }
                pos = copy++;
            }
        }
        else {
            /** backslash escapes the next character */
            ++space_needed;
            if (pos[1]) ++pos;
            if (space > 1) {
                *write++ = *pos;
                --space;
            }
            copy = pos + 1;
        }
    }
    if (copy < pos) {
        space_needed += str_strlcpy(write, copy, space);
    }
    return space_needed;
}